

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_long_option
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  value_type *__x;
  char *pcVar1;
  int option_style;
  long lVar2;
  invalid_command_line_syntax *this_00;
  string name;
  string adjacent;
  option opt;
  
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (((2 < __x->_M_string_length) && (pcVar1 = (__x->_M_dataplus)._M_p, *pcVar1 == '-')) &&
     (pcVar1[1] == '-')) {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    adjacent._M_dataplus._M_p = (pointer)&adjacent.field_2;
    adjacent._M_string_length = 0;
    adjacent.field_2._M_local_buf[0] = '\0';
    lVar2 = std::__cxx11::string::find((char)__x,0x3d);
    if (lVar2 == -1) {
      std::__cxx11::string::substr((ulong)&opt,(ulong)__x);
      std::__cxx11::string::operator=((string *)&name,(string *)&opt);
      std::__cxx11::string::~string((string *)&opt);
    }
    else {
      std::__cxx11::string::substr((ulong)&opt,(ulong)__x);
      std::__cxx11::string::operator=((string *)&name,(string *)&opt);
      std::__cxx11::string::~string((string *)&opt);
      std::__cxx11::string::substr((ulong)&opt,(ulong)__x);
      std::__cxx11::string::operator=((string *)&adjacent,(string *)&opt);
      std::__cxx11::string::~string((string *)&opt);
      if (adjacent._M_string_length == 0) {
        this_00 = (invalid_command_line_syntax *)__cxa_allocate_exception(0xc0);
        option_style = get_canonical_option_prefix(this);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (this_00,empty_adjacent_parameter,&name,&name,option_style);
        __cxa_throw(this_00,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
    }
    opt.string_key._M_dataplus._M_p = (pointer)&opt.string_key.field_2;
    opt.string_key._M_string_length = 0;
    opt.string_key.field_2._M_local_buf[0] = '\0';
    opt.position_key = -1;
    opt.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opt.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opt.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    opt.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opt.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opt.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    opt.unregistered = false;
    opt.case_insensitive = false;
    std::__cxx11::string::_M_assign((string *)&opt);
    if (adjacent._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&opt.value,&adjacent);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&opt.original_tokens,__x);
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::push_back(__return_storage_ptr__,&opt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(args,(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
    basic_option<char>::~basic_option(&opt);
    std::__cxx11::string::~string((string *)&adjacent);
    std::__cxx11::string::~string((string *)&name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<option>
command_line_parser::parse_long_option(std::vector<std::string>& args)
{
    std::vector<option> result;
    const std::string& tok = args[0];
    if (tok.size() >= 3 && tok[0] == '-' && tok[1] == '-')
    {
        std::string name, adjacent;

        std::string::size_type p = tok.find('=');
        if (p != tok.npos)
        {
            name = tok.substr(2, p-2);
            adjacent = tok.substr(p+1);
            if (adjacent.empty()) {
                throw invalid_command_line_syntax(
                    invalid_command_line_syntax::empty_adjacent_parameter,
                    name, name,
                    get_canonical_option_prefix());
            }
        }
        else
        {
            name = tok.substr(2);
        }
        option opt;
        opt.string_key = name;
        if (!adjacent.empty())
            opt.value.push_back(adjacent);
        opt.original_tokens.push_back(tok);
        result.push_back(opt);
        args.erase(args.begin());
    }
    return result;
}